

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O2

sexp sexp_bignum_sub(sexp ctx,sexp dst,sexp a,sexp b)

{
  char cVar1;
  sexp_sint_t sVar2;
  sexp psVar3;
  char cVar4;
  
  cVar4 = (a->value).flonum_bits[0];
  if (cVar4 == (b->value).flonum_bits[0]) {
    sVar2 = sexp_bignum_compare_abs(a,b);
    cVar1 = -cVar4;
    if (-1 < sVar2) {
      cVar1 = cVar4;
    }
    cVar4 = cVar1;
    psVar3 = sexp_bignum_sub_digits(ctx,dst,a,b);
  }
  else {
    psVar3 = sexp_bignum_add_digits(ctx,dst,a,b);
  }
  (psVar3->value).flonum_bits[0] = cVar4;
  return psVar3;
}

Assistant:

sexp sexp_bignum_sub (sexp ctx, sexp dst, sexp a, sexp b) {
  sexp res;
  int sign;
  if (sexp_bignum_sign(a) == sexp_bignum_sign(b)) {
    sign = (sexp_bignum_compare_abs(a, b) >= 0 ? sexp_bignum_sign(a)
            : -sexp_bignum_sign(a));
    res = sexp_bignum_sub_digits(ctx, dst, a, b);
  } else {
    sign = sexp_bignum_sign(a);
    res = sexp_bignum_add_digits(ctx, dst, a, b);
  }
  sexp_bignum_sign(res) = sign;
  return res;
}